

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O0

float mf_predict<dense_parameters>(gdmf *d,example *ec,dense_parameters *weights)

{
  bool bVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  float fVar4;
  stringstream __msg;
  pred_offset x_dot_r;
  pred_offset x_dot_l;
  uint64_t k;
  string *i_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  features *fs;
  iterator __end1_1;
  iterator __begin1_1;
  example *__range1_1;
  float linear_prediction;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  float prediction;
  label_data *ld;
  vw *all;
  shared_data *in_stack_fffffffffffffcf8;
  example_predict *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  int plineNumber;
  char *in_stack_fffffffffffffd28;
  vw_exception *in_stack_fffffffffffffd30;
  example *in_stack_fffffffffffffd38;
  gdmf *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  pred_offset *in_stack_fffffffffffffd50;
  features *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  stringstream local_268 [16];
  ostream local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  float local_d0;
  long local_c8;
  float local_c0;
  ulong local_b8;
  ulong local_b0;
  reference local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  long local_90;
  features *local_88;
  iterator local_80;
  iterator local_70;
  long local_60;
  float local_54;
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  long local_38;
  float local_2c;
  float *local_28;
  undefined8 *local_20;
  undefined8 local_18;
  long local_10;
  long *local_8;
  
  local_20 = (undefined8 *)*in_RDI;
  local_28 = (float *)(in_RSI + 0x6828);
  local_2c = *(float *)(in_RSI + 0x6830);
  local_38 = *in_RDI + 0x380;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffcf8);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffcf8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd00,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffcf8), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_40);
    in_stack_fffffffffffffd38 = (example *)(local_10 + 0x20);
    std::__cxx11::string::operator[]((ulong)local_50);
    in_stack_fffffffffffffd48 = features::size((features *)0x27d49c);
    in_stack_fffffffffffffd40 = (gdmf *)(local_10 + 0x20);
    std::__cxx11::string::operator[]((ulong)local_50);
    sVar2 = features::size((features *)0x27d4da);
    *(size_t *)(local_10 + 0x68a0) =
         *(long *)(local_10 + 0x68a0) - in_stack_fffffffffffffd48 * sVar2;
    in_stack_fffffffffffffd50 = (pred_offset *)(local_10 + 0x20);
    std::__cxx11::string::operator[]((ulong)local_50);
    sVar2 = features::size((features *)0x27d534);
    *(size_t *)(local_10 + 0x68a0) = sVar2 * *(uint *)(local_8 + 5) + *(long *)(local_10 + 0x68a0);
    in_stack_fffffffffffffd58 = (features *)(local_10 + 0x20);
    std::__cxx11::string::operator[]((ulong)local_50);
    sVar2 = features::size((features *)0x27d595);
    *(size_t *)(local_10 + 0x68a0) = sVar2 * *(uint *)(local_8 + 5) + *(long *)(local_10 + 0x68a0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_40);
  }
  v_array<float>::clear((v_array<float> *)in_stack_fffffffffffffd00);
  local_54 = 0.0;
  local_60 = local_10;
  local_70 = example_predict::begin(in_stack_fffffffffffffd00);
  local_80 = example_predict::end(in_stack_fffffffffffffd00);
  while (bVar1 = example_predict::iterator::operator!=(&local_70,&local_80), bVar1) {
    local_88 = example_predict::iterator::operator*(&local_70);
    GD::foreach_feature<float,_&GD::vec_add,_dense_parameters>
              ((dense_parameters *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd58,&in_stack_fffffffffffffd50->p,in_stack_fffffffffffffd48,
               (float)((ulong)in_stack_fffffffffffffd40 >> 0x20));
    example_predict::iterator::operator++(&local_70);
  }
  v_array<float>::push_back
            ((v_array<float> *)in_stack_fffffffffffffd00,(float *)in_stack_fffffffffffffcf8);
  local_2c = local_54 + local_2c;
  local_90 = *local_8 + 0x380;
  local_98._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffcf8);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffcf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd00,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcf8);
    plineNumber = (int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
    if (!bVar1) break;
    local_a8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_98);
    in_stack_fffffffffffffd30 = (vw_exception *)(local_10 + 0x20);
    std::__cxx11::string::operator[]((ulong)local_a8);
    sVar2 = features::size((features *)0x27d780);
    if (sVar2 != 0) {
      in_stack_fffffffffffffd28 = (char *)(local_10 + 0x20);
      std::__cxx11::string::operator[]((ulong)local_a8);
      sVar2 = features::size((features *)0x27d7c3);
      if (sVar2 != 0) {
        for (local_b0 = 1; local_b0 <= *(uint *)(local_8 + 5); local_b0 = local_b0 + 1) {
          local_c0 = 0.0;
          local_b8 = local_b0;
          std::__cxx11::string::operator[]((ulong)local_a8);
          GD::foreach_feature<pred_offset,_&offset_add,_dense_parameters>
                    ((dense_parameters *)
                     CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     (float)((ulong)in_stack_fffffffffffffd40 >> 0x20));
          local_d0 = 0.0;
          local_c8 = local_b0 + *(uint *)(local_8 + 5);
          in_stack_fffffffffffffd18 = (string *)(local_10 + 0x20);
          in_stack_fffffffffffffd20 = local_18;
          std::__cxx11::string::operator[]((ulong)local_a8);
          GD::foreach_feature<pred_offset,_&offset_add,_dense_parameters>
                    ((dense_parameters *)
                     CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     (float)((ulong)in_stack_fffffffffffffd40 >> 0x20));
          local_2c = local_c0 * local_d0 + local_2c;
          v_array<float>::push_back
                    ((v_array<float> *)in_stack_fffffffffffffd00,(float *)in_stack_fffffffffffffcf8)
          ;
          v_array<float>::push_back
                    ((v_array<float> *)in_stack_fffffffffffffd00,(float *)in_stack_fffffffffffffcf8)
          ;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_98);
  }
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffcf8);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffcf8);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffd00,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffcf8);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_268);
    std::operator<<(&local_258,"cannot use triples in matrix factorization");
    uVar3 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,plineNumber,
               in_stack_fffffffffffffd18);
    __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  *(float *)(local_10 + 0x68a8) = local_2c;
  (*(code *)local_20[8])(*local_28,*local_20);
  fVar4 = GD::finalize_prediction(in_stack_fffffffffffffcf8,0.0);
  *(float *)(local_10 + 0x6850) = fVar4;
  if ((*local_28 != 3.4028235e+38) || (NAN(*local_28))) {
    fVar4 = (float)(**(code **)(*(long *)local_20[0x6a9] + 8))
                             (*(undefined4 *)(local_10 + 0x6850),*local_28,(long *)local_20[0x6a9],
                              *local_20);
    *(float *)(local_10 + 0x68b0) = fVar4 * *(float *)(local_10 + 0x6870);
  }
  if ((*(byte *)(local_20 + 0x687) & 1) != 0) {
    mf_print_audit_features
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30
              );
  }
  return *(float *)(local_10 + 0x6850);
}

Assistant:

float mf_predict(gdmf& d, example& ec, T& weights)
{
  vw& all = *d.all;
  label_data& ld = ec.l.simple;
  float prediction = ld.initial;

  for (string& i : d.all->pairs)
  {
    ec.num_features -= ec.feature_space[(int)i[0]].size() * ec.feature_space[(int)i[1]].size();
    ec.num_features += ec.feature_space[(int)i[0]].size() * d.rank;
    ec.num_features += ec.feature_space[(int)i[1]].size() * d.rank;
  }

  // clear stored predictions
  d.scalars.clear();

  float linear_prediction = 0.;
  // linear terms

  for (features& fs : ec) GD::foreach_feature<float, GD::vec_add, T>(weights, fs, linear_prediction);

  // store constant + linear prediction
  // note: constant is now automatically added
  d.scalars.push_back(linear_prediction);

  prediction += linear_prediction;
  // interaction terms
  for (string& i : d.all->pairs)
  {
    if (ec.feature_space[(int)i[0]].size() > 0 && ec.feature_space[(int)i[1]].size() > 0)
    {
      for (uint64_t k = 1; k <= d.rank; k++)
      {
        // x_l * l^k
        // l^k is from index+1 to index+d.rank
        // float x_dot_l = sd_offset_add(weights, ec.atomics[(int)(*i)[0]].begin(), ec.atomics[(int)(*i)[0]].end(), k);
        pred_offset x_dot_l = {0., k};
        GD::foreach_feature<pred_offset, offset_add, T>(weights, ec.feature_space[(int)i[0]], x_dot_l);
        // x_r * r^k
        // r^k is from index+d.rank+1 to index+2*d.rank
        // float x_dot_r = sd_offset_add(weights, ec.atomics[(int)(*i)[1]].begin(), ec.atomics[(int)(*i)[1]].end(),
        // k+d.rank);
        pred_offset x_dot_r = {0., k + d.rank};
        GD::foreach_feature<pred_offset, offset_add, T>(weights, ec.feature_space[(int)i[1]], x_dot_r);

        prediction += x_dot_l.p * x_dot_r.p;

        // store prediction from interaction terms
        d.scalars.push_back(x_dot_l.p);
        d.scalars.push_back(x_dot_r.p);
      }
    }
  }

  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");

  // d.scalars has linear, x_dot_l_1, x_dot_r_1, x_dot_l_2, x_dot_r_2, ...

  ec.partial_prediction = prediction;

  all.set_minmax(all.sd, ld.label);

  ec.pred.scalar = GD::finalize_prediction(all.sd, ec.partial_prediction);

  if (ld.label != FLT_MAX)
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;

  if (all.audit)
    mf_print_audit_features(d, ec, 0);

  return ec.pred.scalar;
}